

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int ns_hexdump(void *buf,int len,char *dst,int dst_len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  char ascii [17];
  char local_58 [32];
  ulong local_38;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = 0;
  if (len < 1) {
    iVar3 = 0;
  }
  else {
    local_38 = (ulong)(uint)len;
    uVar5 = 0;
    iVar3 = 0;
    do {
      if ((uVar5 & 0xf) == 0) {
        if (uVar5 != 0) {
          iVar2 = snprintf(dst + iVar3,(long)(dst_len - iVar3),"  %s\n",local_58);
          iVar3 = iVar2 + iVar3;
        }
        iVar2 = snprintf(dst + iVar3,(long)(dst_len - iVar3),"%04x ",uVar5 & 0xffffffff);
        iVar3 = iVar2 + iVar3;
      }
      iVar2 = snprintf(dst + iVar3,(long)(dst_len - iVar3)," %02x",
                       (ulong)*(byte *)((long)buf + uVar5));
      iVar3 = iVar2 + iVar3;
      cVar4 = *(char *)((long)buf + uVar5);
      if ((byte)(*(char *)((long)buf + uVar5) + 0x81U) < 0xa1) {
        cVar4 = '.';
      }
      local_58[(uint)uVar5 & 0xf] = cVar4;
      local_58[(uVar5 & 0xf) + 1] = '\0';
      uVar5 = uVar5 + 1;
    } while (local_38 != uVar5);
    if ((len & 0xfU) != 0) {
      uVar6 = len + 1;
      do {
        iVar2 = snprintf(dst + iVar3,(long)(dst_len - iVar3),"%s","   ");
        iVar3 = iVar2 + iVar3;
        uVar1 = uVar6 & 0xf;
        uVar6 = uVar6 + 1;
      } while (uVar1 != 0);
    }
  }
  iVar2 = snprintf(dst + iVar3,(long)(dst_len - iVar3),"  %s\n\n",local_58);
  return iVar2 + iVar3;
}

Assistant:

int ns_hexdump(const void *buf, int len, char *dst, int dst_len) {
  const unsigned char *p = (const unsigned char *) buf;
  char ascii[17] = "";
  int i, idx, n = 0;

  for (i = 0; i < len; i++) {
    idx = i % 16;
    if (idx == 0) {
      if (i > 0) n += snprintf(dst + n, dst_len - n, "  %s\n", ascii);
      n += snprintf(dst + n, dst_len - n, "%04x ", i);
    }
    n += snprintf(dst + n, dst_len - n, " %02x", p[i]);
    ascii[idx] = p[i] < 0x20 || p[i] > 0x7e ? '.' : p[i];
    ascii[idx + 1] = '\0';
  }

  while (i++ % 16) n += snprintf(dst + n, dst_len - n, "%s", "   ");
  n += snprintf(dst + n, dst_len - n, "  %s\n\n", ascii);

  return n;
}